

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SupportVectorClassifier::SerializeWithCachedSizes
          (SupportVectorClassifier *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  int32 value;
  uint uVar3;
  Coefficients *value_00;
  RepeatedField<double> *pRVar4;
  double *pdVar5;
  uint local_28;
  uint n_1;
  uint i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SupportVectorClassifier *this_local;
  
  bVar1 = has_kernel(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->kernel_->super_MessageLite,output);
  }
  iVar2 = numberofsupportvectorsperclass_size(this);
  if (0 < iVar2) {
    google::protobuf::internal::WireFormatLite::WriteTag(2,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_numberofsupportvectorsperclass_cached_byte_size_);
  }
  i_1 = 0;
  iVar2 = numberofsupportvectorsperclass_size(this);
  for (; (int)i_1 < iVar2; i_1 = i_1 + 1) {
    value = numberofsupportvectorsperclass(this,i_1);
    google::protobuf::internal::WireFormatLite::WriteInt32NoTag(value,output);
  }
  bVar1 = has_sparsesupportvectors(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&((this->supportVectors_).sparsesupportvectors_)->super_MessageLite,output);
  }
  bVar1 = has_densesupportvectors(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&((this->supportVectors_).sparsesupportvectors_)->super_MessageLite,output);
  }
  local_28 = 0;
  uVar3 = coefficients_size(this);
  for (; local_28 < uVar3; local_28 = local_28 + 1) {
    value_00 = coefficients(this,local_28);
    google::protobuf::internal::WireFormatLite::WriteMessage(5,&value_00->super_MessageLite,output);
  }
  iVar2 = rho_size(this);
  if (0 < iVar2) {
    google::protobuf::internal::WireFormatLite::WriteTag(6,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_rho_cached_byte_size_);
    pRVar4 = rho(this);
    pdVar5 = google::protobuf::RepeatedField<double>::data(pRVar4);
    iVar2 = rho_size(this);
    google::protobuf::internal::WireFormatLite::WriteDoubleArray(pdVar5,iVar2,output);
  }
  iVar2 = proba_size(this);
  if (0 < iVar2) {
    google::protobuf::internal::WireFormatLite::WriteTag(7,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_proba_cached_byte_size_);
    pRVar4 = proba(this);
    pdVar5 = google::protobuf::RepeatedField<double>::data(pRVar4);
    iVar2 = proba_size(this);
    google::protobuf::internal::WireFormatLite::WriteDoubleArray(pdVar5,iVar2,output);
  }
  iVar2 = probb_size(this);
  if (0 < iVar2) {
    google::protobuf::internal::WireFormatLite::WriteTag(8,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_probb_cached_byte_size_);
    pRVar4 = probb(this);
    pdVar5 = google::protobuf::RepeatedField<double>::data(pRVar4);
    iVar2 = probb_size(this);
    google::protobuf::internal::WireFormatLite::WriteDoubleArray(pdVar5,iVar2,output);
  }
  bVar1 = has_stringclasslabels(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (100,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
  }
  bVar1 = has_int64classlabels(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x65,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
  }
  return;
}

Assistant:

void SupportVectorClassifier::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SupportVectorClassifier)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.Kernel kernel = 1;
  if (this->has_kernel()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->kernel_, output);
  }

  // repeated int32 numberOfSupportVectorsPerClass = 2;
  if (this->numberofsupportvectorsperclass_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_numberofsupportvectorsperclass_cached_byte_size_);
  }
  for (int i = 0, n = this->numberofsupportvectorsperclass_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32NoTag(
      this->numberofsupportvectorsperclass(i), output);
  }

  // .CoreML.Specification.SparseSupportVectors sparseSupportVectors = 3;
  if (has_sparsesupportvectors()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *supportVectors_.sparsesupportvectors_, output);
  }

  // .CoreML.Specification.DenseSupportVectors denseSupportVectors = 4;
  if (has_densesupportvectors()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *supportVectors_.densesupportvectors_, output);
  }

  // repeated .CoreML.Specification.Coefficients coefficients = 5;
  for (unsigned int i = 0, n = this->coefficients_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      5, this->coefficients(i), output);
  }

  // repeated double rho = 6;
  if (this->rho_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(6, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_rho_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->rho().data(), this->rho_size(), output);
  }

  // repeated double probA = 7;
  if (this->proba_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(7, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_proba_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->proba().data(), this->proba_size(), output);
  }

  // repeated double probB = 8;
  if (this->probb_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(8, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_probb_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->probb().data(), this->probb_size(), output);
  }

  // .CoreML.Specification.StringVector stringClassLabels = 100;
  if (has_stringclasslabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      100, *ClassLabels_.stringclasslabels_, output);
  }

  // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
  if (has_int64classlabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      101, *ClassLabels_.int64classlabels_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SupportVectorClassifier)
}